

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dscal.c
# Opt level: O0

int dscal_(int *n,double *sa,double *sx,int *incx)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double ssa;
  long iincx;
  long nn;
  long nincx;
  long m;
  long i;
  int *incx_local;
  double *sx_local;
  double *sa_local;
  int *n_local;
  
  lVar2 = (long)*n;
  lVar3 = (long)*incx;
  dVar1 = *sa;
  if ((0 < lVar2) && (0 < lVar3)) {
    if (lVar3 == 1) {
      for (m = 0; m < lVar2 + -4; m = m + 5) {
        sx[m] = dVar1 * sx[m];
        sx[m + 1] = dVar1 * sx[m + 1];
        sx[m + 2] = dVar1 * sx[m + 2];
        sx[m + 3] = dVar1 * sx[m + 3];
        sx[m + 4] = dVar1 * sx[m + 4];
      }
      for (; m < lVar2; m = m + 1) {
        sx[m] = dVar1 * sx[m];
      }
    }
    else {
      for (m = 0; m < lVar2 * lVar3; m = lVar3 + m) {
        sx[m] = dVar1 * sx[m];
      }
    }
  }
  return 0;
}

Assistant:

int dscal_(int *n, double *sa, double *sx, int *incx)
{
  long int i, m, nincx, nn, iincx;
  double ssa;

  /* scales a vector by a constant.   
     uses unrolled loops for increment equal to 1.   
     jack dongarra, linpack, 3/11/78.   
     modified 3/93 to return if incx .le. 0.   
     modified 12/3/93, array(1) declarations changed to array(*) */

  /* Dereference inputs */
  nn = *n;
  iincx = *incx;
  ssa = *sa;

  if (nn > 0 && iincx > 0)
  {
    if (iincx == 1) /* code for increment equal to 1 */
    {
      m = nn-4;
      for (i = 0; i < m; i += 5)
      {
        sx[i] = ssa * sx[i];
        sx[i+1] = ssa * sx[i+1];
        sx[i+2] = ssa * sx[i+2];
        sx[i+3] = ssa * sx[i+3];
        sx[i+4] = ssa * sx[i+4];
      }
      for ( ; i < nn; ++i) /* clean-up loop */
        sx[i] = ssa * sx[i];
    }
    else /* code for increment not equal to 1 */
    {
      nincx = nn * iincx;
      for (i = 0; i < nincx; i += iincx)
        sx[i] = ssa * sx[i];
    }
  }

  return 0;
}